

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O2

_Bool wb_tree_verify(wb_tree *tree)

{
  wb_node *node;
  size_t sVar1;
  _Bool _Var2;
  undefined8 uVar3;
  char *pcVar4;
  uint root_weight;
  uint local_c;
  
  node = tree->root;
  sVar1 = tree->count;
  if (node == (wb_node *)0x0) {
    if (sVar1 == 0) {
LAB_00106007:
      _Var2 = node_verify(tree,(wb_node *)0x0,node,&local_c);
      return _Var2;
    }
    pcVar4 = "tree->count == 0";
    uVar3 = 0x1a2;
  }
  else if (sVar1 == 0) {
    pcVar4 = "tree->count > 0";
    uVar3 = 0x19f;
  }
  else {
    if (sVar1 + 1 == (ulong)node->weight) goto LAB_00106007;
    pcVar4 = "tree->count + 1 == tree->root->weight";
    uVar3 = 0x1a0;
  }
  fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
          ,uVar3,"wb_tree_verify",pcVar4);
  return false;
}

Assistant:

bool
wb_tree_verify(const wb_tree* tree)
{
    if (tree->root) {
	VERIFY(tree->count > 0);
	VERIFY(tree->count + 1 == tree->root->weight);
    } else {
	VERIFY(tree->count == 0);
    }
    unsigned root_weight;
    return node_verify(tree, NULL, tree->root, &root_weight);
}